

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.cpp
# Opt level: O0

value * mjs::json_stringify(value *__return_storage_ptr__,gc_heap_ptr<mjs::global_object> *global,
                           vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  bool bVar1;
  object *poVar2;
  global_object *pgVar3;
  const_reference pvVar4;
  object_ptr *in_R9;
  wstring_view key;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_e0;
  undefined1 local_d0 [8];
  stringify_state s;
  undefined1 local_30 [8];
  object_ptr wrapper;
  vector<mjs::value,_std::allocator<mjs::value>_> *args_local;
  gc_heap_ptr<mjs::global_object> *global_local;
  
  wrapper.super_gc_heap_ptr_untyped._8_8_ = args;
  bVar1 = std::vector<mjs::value,_std::allocator<mjs::value>_>::empty(args);
  if (bVar1) {
    value::value(__return_storage_ptr__,(value *)value::undefined);
  }
  else {
    gc_heap_ptr<mjs::global_object>::operator->(global);
    global_object::make_object((global_object *)local_30);
    poVar2 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_30);
    pgVar3 = gc_heap_ptr<mjs::global_object>::operator->(global);
    (*(pgVar3->super_object)._vptr_object[0x13])
              ((undefined1 *)((long)&s.gap_.field_2 + 8),pgVar3,"");
    pvVar4 = std::vector<mjs::value,_std::allocator<mjs::value>_>::front
                       ((vector<mjs::value,_std::allocator<mjs::value>_> *)
                        wrapper.super_gc_heap_ptr_untyped._8_8_);
    (*poVar2->_vptr_object[1])(poVar2,(undefined1 *)((long)&s.gap_.field_2 + 8),pvVar4,0);
    string::~string((string *)((long)&s.gap_.field_2 + 8));
    anon_unknown_46::stringify_state::stringify_state
              ((stringify_state *)local_d0,global,
               (vector<mjs::value,_std::allocator<mjs::value>_> *)
               wrapper.super_gc_heap_ptr_untyped._8_8_);
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view(&local_e0,L"");
    key._M_str = (wchar_t *)local_30;
    key._M_len = (size_t)local_e0._M_str;
    anon_unknown_46::json_str
              (__return_storage_ptr__,(anon_unknown_46 *)local_d0,(stringify_state *)local_e0._M_len
               ,key,in_R9);
    anon_unknown_46::stringify_state::~stringify_state((stringify_state *)local_d0);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

value json_stringify(const gc_heap_ptr<global_object>& global, const std::vector<value>& args) {
    if (args.empty()) {
        return value::undefined;
    }

    auto wrapper = global->make_object();
    wrapper->put(global->common_string(""), args.front());

    stringify_state s{global, args};

    return json_str(s, L"", wrapper);
}